

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::WATParser::TableType> *
wasm::WATParser::tabletypeContinued<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::WATParser::TableType> *__return_storage_ptr__,ParseDeclsCtx *ctx,
          Type addressType)

{
  undefined8 uVar1;
  ParseDeclsCtx *pPVar2;
  bool bVar3;
  TableType local_150;
  Err local_130;
  Err *local_110;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> type;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::WATParser::Limits> _val;
  undefined1 local_48 [8];
  Result<wasm::WATParser::Limits> limits;
  ParseDeclsCtx *ctx_local;
  Type addressType_local;
  
  _val.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._36_4_ = 2;
  limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._32_8_ = ctx;
  ctx_local = (ParseDeclsCtx *)addressType.id;
  addressType_local.id = (uintptr_t)__return_storage_ptr__;
  bVar3 = wasm::Type::operator==
                    ((Type *)&ctx_local,
                     (BasicType *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err> + 0x24));
  if (bVar3) {
    limits32<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::WATParser::Limits> *)local_48,
               (ParseDeclsCtx *)
               limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._32_8_);
  }
  else {
    limits64<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::WATParser::Limits> *)local_48,
               (ParseDeclsCtx *)
               limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._32_8_);
  }
  Result<wasm::WATParser::Limits>::Result
            ((Result<wasm::WATParser::Limits> *)local_78,(Result<wasm::WATParser::Limits> *)local_48
            );
  local_90 = Result<wasm::WATParser::Limits>::getErr((Result<wasm::WATParser::Limits> *)local_78);
  bVar3 = local_90 == (Err *)0x0;
  if (!bVar3) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::WATParser::TableType>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<wasm::WATParser::Limits>::~Result((Result<wasm::WATParser::Limits> *)local_78);
  if (bVar3) {
    reftype<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (ParseDeclsCtx *)
               limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._32_8_);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)&err_1,
               (Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    local_110 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    bVar3 = local_110 == (Err *)0x0;
    if (!bVar3) {
      wasm::Err::Err(&local_130,local_110);
      Result<wasm::WATParser::TableType>::Result(__return_storage_ptr__,&local_130);
      wasm::Err::~Err(&local_130);
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    pPVar2 = ctx_local;
    uVar1 = limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._32_8_;
    if (bVar3) {
      Result<wasm::WATParser::Limits>::operator*((Result<wasm::WATParser::Limits> *)local_48);
      Result<wasm::Ok>::operator*
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      ParseDeclsCtx::makeTableType(&local_150,(ParseDeclsCtx *)uVar1,pPVar2);
      Result<wasm::WATParser::TableType>::Result<wasm::WATParser::TableType>
                (__return_storage_ptr__,&local_150);
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  Result<wasm::WATParser::Limits>::~Result((Result<wasm::WATParser::Limits> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TableTypeT> tabletypeContinued(Ctx& ctx,
                                                    Type addressType) {
  auto limits = addressType == Type::i32 ? limits32(ctx) : limits64(ctx);
  CHECK_ERR(limits);
  auto type = reftype(ctx);
  CHECK_ERR(type);
  return ctx.makeTableType(addressType, *limits, *type);
}